

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkTestTimCollectCone(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  int Fill;
  long lVar5;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 1000;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  vNodes->pArray = ppvVar3;
  if (pObj == (Abc_Obj_t *)0x0) {
    pVVar4 = pNtk->vCos;
    if (0 < pVVar4->nSize) {
      lVar5 = 0;
      do {
        Abc_NtkTestTimCollectCone_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*pVVar4->pArray[lVar5] + 0x20) + 8) +
                    (long)**(int **)((long)pVVar4->pArray[lVar5] + 0x20) * 8),vNodes);
        lVar5 = lVar5 + 1;
        pVVar4 = pNtk->vCos;
      } while (lVar5 < pVVar4->nSize);
    }
  }
  else {
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                    ,0xd4,"Vec_Ptr_t *Abc_NtkTestTimCollectCone(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    pAVar2 = pObj->pNtk;
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar2->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((pAVar2->vTravIds).pArray[iVar1] == pObj->pNtk->nTravIds) {
      __assert_fail("!Abc_NodeIsTravIdCurrent( pObj )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                    ,0xd5,"Vec_Ptr_t *Abc_NtkTestTimCollectCone(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    Abc_NtkTestTimCollectCone_rec(pObj,vNodes);
    if (vNodes->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    vNodes->nSize = vNodes->nSize + -1;
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_NtkTestTimCollectCone( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    Vec_Ptr_t * vCone = Vec_PtrAlloc( 1000 );
    if ( pObj != NULL )
    {
        // collect for one node
        assert( Abc_ObjIsNode(pObj) );
        assert( !Abc_NodeIsTravIdCurrent( pObj ) );
        Abc_NtkTestTimCollectCone_rec( pObj, vCone );
        // remove the node because it is a white box
        Vec_PtrPop( vCone );
    }
    else
    {
        // collect for all COs
        Abc_Obj_t * pObj;
        int i;
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_NtkTestTimCollectCone_rec( Abc_ObjFanin0(pObj), vCone );
    }
    return vCone;

}